

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::module_::add_object(module_ *this,char *name,handle obj,bool overwrite)

{
  PyObject *pPVar1;
  char *pcVar2;
  bool bVar3;
  PyObject **ppPVar4;
  handle *this_00;
  PyObject *pPVar5;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  PyObject *local_30;
  undefined1 local_21;
  char *pcStack_20;
  bool overwrite_local;
  char *name_local;
  module_ *this_local;
  handle obj_local;
  
  local_21 = overwrite;
  pcStack_20 = name;
  name_local = (char *)this;
  this_local = (module_ *)obj.m_ptr;
  if (!overwrite) {
    local_30 = (this->super_object).super_handle.m_ptr;
    bVar3 = hasattr((handle)local_30,name);
    pcVar2 = pcStack_20;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar2,&local_91);
      std::operator+(&local_70,
                     "Error during initialization: multiple incompatible definitions with name \"",
                     &local_90);
      std::operator+(&local_50,&local_70,"\"");
      pybind11_fail(&local_50);
    }
  }
  ppPVar4 = pybind11::handle::ptr((handle *)this);
  pcVar2 = pcStack_20;
  pPVar1 = *ppPVar4;
  this_00 = pybind11::handle::inc_ref((handle *)&this_local);
  pPVar5 = pybind11::handle::ptr(this_00);
  PyModule_AddObject(pPVar1,pcVar2,pPVar5);
  return;
}

Assistant:

PYBIND11_NOINLINE void add_object(const char *name, handle obj, bool overwrite = false) {
        if (!overwrite && hasattr(*this, name))
            pybind11_fail("Error during initialization: multiple incompatible definitions with name \"" +
                    std::string(name) + "\"");

        PyModule_AddObject(ptr(), name, obj.inc_ref().ptr() /* steals a reference */);
    }